

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numericconstant.cpp
# Opt level: O3

char NumericConstantChars::getChar(NumericConstantChar numChar)

{
  return (&DAT_00139b4c)[(char)numChar];
}

Assistant:

char NumericConstantChars::getChar(NumericConstantChar numChar) {
	switch (numChar) {
		case NumericConstantChar::Zero:
			return '0';
		case NumericConstantChar::One:
			return '1';
		case NumericConstantChar::Two:
			return '2';
		case NumericConstantChar::Three:
			return '3';
		case NumericConstantChar::Four:
			return '4';
		case NumericConstantChar::Five:
			return '5';
		case NumericConstantChar::Six:
			return '6';
		case NumericConstantChar::Seven:
			return '7';
		case NumericConstantChar::Eight:
			return '8';
		case NumericConstantChar::Nine:
			return '9';
		case NumericConstantChar::A:
			return 'a';
		case NumericConstantChar::B:
			return 'b';
		case NumericConstantChar::C:
			return 'c';
		case NumericConstantChar::D:
			return 'd';
		case NumericConstantChar::E:
			return 'e';
		case NumericConstantChar::F:
			return 'f';
		case NumericConstantChar::MinusSign:
			return '-';
		case NumericConstantChar::PlusSign:
			return '+';
		case NumericConstantChar::DecimalPoint:
			return '.';
		case NumericConstantChar::ImaginaryUnit:
			return 'i';
	}
}